

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 UVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  seqStore_t *psVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  int *piVar11;
  BYTE *pBVar12;
  uint uVar13;
  BYTE *pBVar14;
  U32 UVar15;
  int *piVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int *iend;
  int *piVar24;
  long lVar25;
  seqDef *psVar26;
  uint uVar27;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_f8;
  ZSTD_matchState_t *local_f0;
  int *local_e8;
  ulong local_e0;
  seqStore_t *local_d8;
  BYTE *local_d0;
  BYTE *local_c8;
  int *local_c0;
  uint local_b4;
  int local_b0;
  uint local_ac;
  BYTE *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  ulong local_78;
  U32 *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e8 = (int *)((long)src + srcSize);
  local_c0 = (int *)((long)src + (srcSize - 8));
  local_c8 = (ms->window).base;
  local_d0 = (ms->window).dictBase;
  uVar13 = (ms->window).dictLimit;
  local_e0 = (ulong)uVar13;
  local_a8 = local_c8 + local_e0;
  uVar7 = (ms->window).lowLimit;
  uVar22 = (ms->cParams).windowLog;
  uVar27 = (ms->cParams).minMatch;
  uVar21 = 6;
  if (uVar27 < 6) {
    uVar21 = uVar27;
  }
  local_ac = 4;
  if (4 < uVar21) {
    local_ac = uVar21;
  }
  uVar18 = (ulong)*rep;
  uVar27 = rep[1];
  uVar23 = (ulong)uVar27;
  ms->lazySkipping = 0;
  piVar16 = (int *)((ulong)(local_a8 == (BYTE *)src) + (long)src);
  local_70 = rep;
  if (piVar16 < local_c0) {
    local_90 = (int *)(local_d0 + local_e0);
    local_68 = local_d0 + uVar7;
    uVar7 = 1 << ((byte)uVar22 & 0x1f);
    local_88 = (ulong)uVar7;
    local_b0 = uVar13 - 1;
    local_80 = local_e8 + -8;
    iVar8 = (int)local_c8;
    local_58 = (ulong)(1 - (uVar7 + iVar8));
    local_50 = (ulong)(1 - iVar8);
    local_60 = (ulong)((uVar13 + iVar8) - 2);
    local_f0 = ms;
    local_d8 = seqStore;
    do {
      piVar10 = local_e8;
      iVar8 = ((int)piVar16 - (int)local_c8) + 1;
      UVar2 = (local_f0->window).lowLimit;
      UVar15 = iVar8 - (uint)local_88;
      if (iVar8 - UVar2 <= (uint)local_88) {
        UVar15 = UVar2;
      }
      if (local_f0->loadedDictEnd != 0) {
        UVar15 = UVar2;
      }
      uVar13 = iVar8 - (uint)uVar18;
      pBVar14 = local_c8;
      if (uVar13 < (uint)local_e0) {
        pBVar14 = local_d0;
      }
      local_a0 = piVar16;
      local_78 = uVar18;
      if (local_b0 - uVar13 < 3) {
LAB_001e2e98:
        piVar24 = (int *)0x0;
      }
      else {
        piVar24 = (int *)0x0;
        if ((uint)uVar18 <= iVar8 - UVar15) {
          if (*(int *)((long)piVar16 + 1) != *(int *)(pBVar14 + uVar13)) goto LAB_001e2e98;
          piVar24 = local_e8;
          if (uVar13 < (uint)local_e0) {
            piVar24 = local_90;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar16 + 5),(BYTE *)((long)(pBVar14 + uVar13) + 4),
                             (BYTE *)local_e8,(BYTE *)piVar24,local_a8);
          piVar24 = (int *)(sVar9 + 4);
        }
      }
      local_f8 = 999999999;
      if (local_ac == 6) {
        piVar10 = (int *)ZSTD_HcFindBestMatch_extDict_6
                                   (local_f0,(BYTE *)local_a0,(BYTE *)piVar10,&local_f8);
      }
      else if (local_ac == 5) {
        piVar10 = (int *)ZSTD_HcFindBestMatch_extDict_5
                                   (local_f0,(BYTE *)local_a0,(BYTE *)piVar10,&local_f8);
      }
      else {
        piVar10 = (int *)ZSTD_HcFindBestMatch_extDict_4
                                   (local_f0,(BYTE *)local_a0,(BYTE *)piVar10,&local_f8);
      }
      piVar11 = piVar24;
      if (piVar24 < piVar10) {
        piVar11 = piVar10;
      }
      if (piVar11 < (int *)0x4) {
        piVar16 = (int *)((long)local_a0 + ((ulong)((long)local_a0 - (long)src) >> 8) + 1);
        local_f0->lazySkipping = (uint)(0x8ff < (ulong)((long)local_a0 - (long)src));
        uVar18 = local_78;
      }
      else {
        local_b4 = (uint)uVar23;
        iend = local_a0;
        uVar23 = local_f8;
        if (piVar10 <= piVar24) {
          iend = (int *)((long)piVar16 + 1);
          uVar23 = 1;
        }
        piVar16 = piVar11;
        if (local_a0 < local_c0) {
          iVar8 = (int)local_a0;
          local_38 = (ulong)(uint)((int)local_58 + iVar8);
          uVar13 = (int)local_50 + iVar8;
          local_40 = (ulong)uVar13;
          uVar7 = ((int)local_60 + (int)local_78) - iVar8;
          local_48 = (ulong)(uVar13 - (int)local_78);
          lVar25 = 0;
          do {
            local_98 = (int *)((long)local_a0 + lVar25 + 1);
            piVar10 = local_98;
            if (uVar23 == 0) {
              uVar23 = 0;
            }
            else {
              UVar2 = (local_f0->window).lowLimit;
              iVar4 = (int)lVar25;
              iVar8 = (int)local_40 + iVar4;
              UVar15 = (int)local_38 + iVar4;
              if (iVar8 - UVar2 <= (uint)local_88) {
                UVar15 = UVar2;
              }
              if (local_f0->loadedDictEnd != 0) {
                UVar15 = UVar2;
              }
              uVar13 = (int)local_48 + iVar4;
              pBVar14 = local_c8;
              if (uVar13 < (uint)local_e0) {
                pBVar14 = local_d0;
              }
              if (((2 < uVar7) && ((uint)local_78 <= iVar8 - UVar15)) &&
                 (*local_98 == *(int *)(pBVar14 + uVar13))) {
                piVar16 = local_e8;
                if (uVar13 < (uint)local_e0) {
                  piVar16 = local_90;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)local_a0 + lVar25 + 5),
                                   (BYTE *)((long)(pBVar14 + uVar13) + 4),(BYTE *)local_e8,
                                   (BYTE *)piVar16,local_a8);
                uVar13 = (uint)uVar23;
                if (uVar13 == 0) goto LAB_001e3584;
                piVar10 = local_98;
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar22 = 0x1f;
                  if (uVar13 != 0) {
                    for (; uVar13 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                    }
                  }
                  if ((int)((uVar22 ^ 0x1f) + (int)piVar11 * 3 + -0x1e) <
                      (int)(int *)(sVar9 + 4) * 3) {
                    uVar23 = 1;
                    piVar11 = (int *)(sVar9 + 4);
                    iend = local_98;
                  }
                }
              }
            }
            local_f8 = 999999999;
            local_98 = piVar11;
            if (local_ac == 6) {
              piVar11 = (int *)ZSTD_HcFindBestMatch_extDict_6
                                         (local_f0,(BYTE *)piVar10,(BYTE *)local_e8,&local_f8);
            }
            else if (local_ac == 5) {
              piVar11 = (int *)ZSTD_HcFindBestMatch_extDict_5
                                         (local_f0,(BYTE *)piVar10,(BYTE *)local_e8,&local_f8);
            }
            else {
              piVar11 = (int *)ZSTD_HcFindBestMatch_extDict_4
                                         (local_f0,(BYTE *)piVar10,(BYTE *)local_e8,&local_f8);
            }
            uVar13 = (uint)local_f8;
            if ((uVar13 == 0) || (uVar22 = (uint)uVar23, uVar22 == 0)) {
LAB_001e3584:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            piVar16 = local_98;
            if (piVar11 < (int *)0x4) goto LAB_001e316a;
            iVar8 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            uVar13 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            if ((int)piVar11 * 4 - iVar8 <= (int)((uVar13 ^ 0x1f) + (int)local_98 * 4 + -0x1b))
            goto LAB_001e316a;
            lVar5 = lVar25 + 1;
            lVar25 = lVar25 + 1;
            uVar7 = uVar7 - 1;
            uVar23 = local_f8;
            iend = piVar10;
          } while ((int *)((long)local_a0 + lVar5) < local_c0);
          iend = (int *)((long)local_a0 + lVar25);
          piVar16 = piVar11;
        }
LAB_001e316a:
        uVar18 = local_78;
        if (3 < uVar23) {
          pcVar17 = (char *)((long)iend + (3 - (long)(local_c8 + uVar23)));
          pBVar12 = local_a8;
          pBVar14 = local_c8;
          if ((uint)pcVar17 < (uint)local_e0) {
            pBVar12 = local_68;
            pBVar14 = local_d0;
          }
          if ((src < iend) && (uVar18 = (ulong)pcVar17 & 0xffffffff, pBVar12 < pBVar14 + uVar18)) {
            pBVar14 = pBVar14 + uVar18;
            do {
              piVar10 = (int *)((long)iend + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar10 != *pBVar14) ||
                 (piVar16 = (int *)((long)piVar16 + 1), iend = piVar10, piVar10 <= src)) break;
            } while (pBVar12 < pBVar14);
          }
          local_b4 = (uint)local_78;
          uVar18 = (ulong)((U32)uVar23 - 3);
        }
        if (local_d8->maxNbSeq <=
            (ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3)) {
LAB_001e361f:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_d8->maxNbLit) {
LAB_001e3600:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar19 = (long)iend - (long)src;
        pBVar14 = local_d8->lit;
        if (local_d8->litStart + local_d8->maxNbLit < pBVar14 + uVar19) {
LAB_001e35a3:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_e8 < iend) {
LAB_001e35c2:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_80 < iend) {
          ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)iend,(BYTE *)local_80);
LAB_001e3268:
          local_d8->lit = local_d8->lit + uVar19;
          if (0xffff < uVar19) {
            if (local_d8->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_d8->longLengthType = ZSTD_llt_literalLength;
            local_d8->longLengthPos =
                 (U32)((ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar14 = *src;
          *(undefined8 *)(pBVar14 + 8) = uVar3;
          pBVar14 = local_d8->lit;
          if (0x10 < uVar19) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar3 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar14 + 0x18) = uVar3;
            if (0x20 < (long)uVar19) {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar25 + 0x20);
                uVar3 = puVar1[1];
                pBVar12 = pBVar14 + lVar25 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)src + lVar25 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar3;
                lVar25 = lVar25 + 0x20;
              } while (pBVar12 + 0x20 < pBVar14 + uVar19);
            }
            goto LAB_001e3268;
          }
          local_d8->lit = pBVar14 + uVar19;
        }
        psVar26 = local_d8->sequences;
        psVar26->litLength = (U16)uVar19;
        psVar26->offBase = (U32)uVar23;
        if (piVar16 < (int *)0x3) {
LAB_001e35e1:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar23 = (ulong)local_b4;
        if ((char *)0xffff < (char *)((long)piVar16 - 3U)) {
          if (local_d8->longLengthType != ZSTD_llt_none) {
LAB_001e363e:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_d8->longLengthType = ZSTD_llt_matchLength;
          local_d8->longLengthPos =
               (U32)((ulong)((long)psVar26 - (long)local_d8->sequencesStart) >> 3);
        }
        psVar26->mlBase = (U16)(char *)((long)piVar16 - 3U);
        psVar26 = psVar26 + 1;
        local_d8->sequences = psVar26;
        if (local_f0->lazySkipping != 0) {
          local_f0->lazySkipping = 0;
        }
        piVar16 = (int *)((long)iend + (long)piVar16);
        src = piVar16;
        if (piVar16 <= local_c0) {
          uVar19 = uVar18 & 0xffffffff;
          do {
            uVar20 = uVar23;
            uVar18 = uVar19;
            iVar8 = (int)piVar16 - (int)local_c8;
            UVar2 = (local_f0->window).lowLimit;
            UVar15 = iVar8 - (uint)local_88;
            if (iVar8 - UVar2 <= (uint)local_88) {
              UVar15 = UVar2;
            }
            if (local_f0->loadedDictEnd != 0) {
              UVar15 = UVar2;
            }
            uVar13 = iVar8 - (uint)uVar20;
            pBVar14 = local_c8;
            if (uVar13 < (uint)local_e0) {
              pBVar14 = local_d0;
            }
            src = piVar16;
            uVar23 = uVar20;
            if (((local_b0 - uVar13 < 3) || (iVar8 - UVar15 < (uint)uVar20)) ||
               (*piVar16 != *(int *)(pBVar14 + uVar13))) break;
            piVar10 = local_e8;
            if (uVar13 < (uint)local_e0) {
              piVar10 = local_90;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar16 + 1),(BYTE *)((long)(pBVar14 + uVar13) + 4),
                               (BYTE *)local_e8,(BYTE *)piVar10,local_a8);
            psVar6 = local_d8;
            if (local_d8->maxNbSeq <= (ulong)((long)psVar26 - (long)local_d8->sequencesStart >> 3))
            goto LAB_001e361f;
            if (0x20000 < local_d8->maxNbLit) goto LAB_001e3600;
            pBVar14 = local_d8->lit;
            if (local_d8->litStart + local_d8->maxNbLit < pBVar14) goto LAB_001e35a3;
            if (local_e8 < piVar16) goto LAB_001e35c2;
            if (local_80 < piVar16) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)piVar16,(BYTE *)piVar16,(BYTE *)local_80);
            }
            else {
              uVar3 = *(undefined8 *)(piVar16 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)piVar16;
              *(undefined8 *)(pBVar14 + 8) = uVar3;
            }
            psVar26 = psVar6->sequences;
            psVar26->litLength = 0;
            psVar26->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_001e35e1;
            if (0xffff < sVar9 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_001e363e;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar26 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar26->mlBase = (U16)(sVar9 + 1);
            psVar26 = psVar26 + 1;
            psVar6->sequences = psVar26;
            piVar16 = (int *)((long)piVar16 + sVar9 + 4);
            uVar19 = uVar20;
            uVar23 = uVar18;
            uVar18 = uVar20;
            src = piVar16;
          } while (piVar16 <= local_c0);
        }
      }
      uVar27 = (uint)uVar23;
    } while (piVar16 < local_c0);
  }
  *local_70 = (U32)uVar18;
  local_70[1] = uVar27;
  return (long)local_e8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}